

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronized_timer.cpp
# Opt level: O0

void __thiscall
jessilib::syncrhonized_timer::syncrhonized_timer
          (syncrhonized_timer *this,duration_t in_period,function_t *in_callback)

{
  function<void_(jessilib::timer_&)> local_98;
  synchonrized_callback local_78;
  function_t local_48;
  duration_t local_28;
  function_t *local_20;
  function_t *in_callback_local;
  syncrhonized_timer *this_local;
  duration_t in_period_local;
  
  local_28.__r = in_period.__r;
  local_20 = in_callback;
  in_callback_local = (function_t *)this;
  this_local = (syncrhonized_timer *)in_period.__r;
  std::function<void_(jessilib::timer_&)>::function(&local_98,in_callback);
  synchonrized_callback::synchonrized_callback(&local_78,&local_98);
  std::function<void(jessilib::timer&)>::function<jessilib::synchonrized_callback,void>
            ((function<void(jessilib::timer&)> *)&local_48,&local_78);
  timer::timer(&this->super_timer,local_28,&local_48);
  std::function<void_(jessilib::timer_&)>::~function(&local_48);
  synchonrized_callback::~synchonrized_callback(&local_78);
  std::function<void_(jessilib::timer_&)>::~function(&local_98);
  return;
}

Assistant:

syncrhonized_timer::syncrhonized_timer(duration_t in_period, function_t in_callback)
	: timer{ in_period, synchonrized_callback{ std::move(in_callback) } } {
	// Empty ctor body
}